

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

int __thiscall QAbstractItemView::sizeHintForColumn(QAbstractItemView *this,int column)

{
  QPersistentModelIndex *this_00;
  QAbstractItemViewPrivate *this_01;
  QAbstractItemModel *pQVar1;
  Data *pDVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QEditorInfo *pQVar6;
  long *plVar7;
  int iVar8;
  QObject *pQVar9;
  int iVar10;
  long in_FS_OFFSET;
  QStyleOptionViewItem option;
  QModelIndex local_140;
  undefined1 *local_128;
  undefined1 *puStack_120;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_118;
  QStyleOptionViewItem local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (column < 0) {
    iVar8 = -1;
  }
  else {
    this_01 = *(QAbstractItemViewPrivate **)(this + 8);
    pQVar1 = this_01->model;
    this_00 = &this_01->root;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_108,this_00);
    iVar3 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,&local_108);
    iVar8 = -1;
    if (column < iVar3) {
      QWidget::ensurePolished((QWidget *)this);
      memset(&local_108,0xaa,0xd0);
      QStyleOptionViewItem::QStyleOptionViewItem(&local_108);
      (**(code **)(*(long *)this + 0x2f8))(this,&local_108);
      pQVar1 = this_01->model;
      QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_128,this_00);
      iVar3 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,(QModelIndex *)&local_128);
      if (iVar3 < 1) {
        iVar8 = 0;
      }
      else {
        iVar10 = 0;
        iVar8 = 0;
        do {
          local_118.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          local_128 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_120 = &DAT_aaaaaaaaaaaaaaaa;
          pQVar1 = this_01->model;
          QPersistentModelIndex::operator_cast_to_QModelIndex(&local_140,this_00);
          (**(code **)(*(long *)pQVar1 + 0x60))
                    ((QModelIndex *)&local_128,pQVar1,iVar10,column,&local_140);
          pQVar6 = QAbstractItemViewPrivate::editorForIndex(this_01,(QModelIndex *)&local_128);
          pDVar2 = (pQVar6->widget).wp.d;
          if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
            pQVar9 = (QObject *)0x0;
          }
          else {
            pQVar9 = (pQVar6->widget).wp.value;
          }
          iVar4 = iVar8;
          if ((pQVar9 != (QObject *)0x0) &&
             (iVar4 = (**(code **)(*(long *)pQVar9 + 0x70))(), iVar4 < iVar8)) {
            iVar4 = iVar8;
          }
          plVar7 = (long *)(**(code **)(*(long *)this + 0x208))(this,(QModelIndex *)&local_128);
          iVar8 = iVar4;
          if ((plVar7 != (long *)0x0) &&
             (iVar5 = (**(code **)(*plVar7 + 0x68))(plVar7,&local_108,(QModelIndex *)&local_128),
             iVar4 <= iVar5)) {
            iVar8 = iVar5;
          }
          iVar10 = iVar10 + 1;
        } while (iVar3 != iVar10);
      }
      QBrush::~QBrush(&local_108.backgroundBrush);
      if (&(local_108.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if (((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
            0) {
          QArrayData::deallocate(&(local_108.text.d.d)->super_QArrayData,2,0x10);
        }
      }
      QIcon::~QIcon(&local_108.icon);
      QLocale::~QLocale(&local_108.locale);
      QFont::~QFont(&local_108.font);
      QStyleOption::~QStyleOption(&local_108.super_QStyleOption);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar8;
}

Assistant:

int QAbstractItemView::sizeHintForColumn(int column) const
{
    Q_D(const QAbstractItemView);

    if (column < 0 || column >= d->model->columnCount(d->root))
        return -1;

    ensurePolished();

    QStyleOptionViewItem option;
    initViewItemOption(&option);
    int width = 0;
    int rows = d->model->rowCount(d->root);
    for (int r = 0; r < rows; ++r) {
        const QModelIndex index = d->model->index(r, column, d->root);
        if (QWidget *editor = d->editorForIndex(index).widget.data())
            width = qMax(width, editor->sizeHint().width());
        if (const QAbstractItemDelegate *delegate = itemDelegateForIndex(index))
            width = qMax(width, delegate->sizeHint(option, index).width());
    }
    return width;
}